

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance.c
# Opt level: O0

void highbd_variance64(uint8_t *a8,int a_stride,uint8_t *b8,int b_stride,int w,int h,uint64_t *sse,
                      int64_t *sum)

{
  int iVar1;
  int diff;
  int j;
  int32_t lsum;
  int i;
  uint64_t tsse;
  int64_t tsum;
  uint16_t *b;
  uint16_t *a;
  int h_local;
  int w_local;
  int b_stride_local;
  uint8_t *b8_local;
  int a_stride_local;
  uint8_t *a8_local;
  
  a = (uint16_t *)((long)a8 << 1);
  b = (uint16_t *)((long)b8 << 1);
  tsum = 0;
  tsse = 0;
  for (i = 0; i < h; i = i + 1) {
    lsum = 0;
    for (j = 0; j < w; j = j + 1) {
      iVar1 = (uint)a[j] - (uint)b[j];
      lsum = iVar1 + lsum;
      tsse = (uint)(iVar1 * iVar1) + tsse;
    }
    tsum = lsum + tsum;
    a = a + a_stride;
    b = b + b_stride;
  }
  *sum = tsum;
  *sse = tsse;
  return;
}

Assistant:

static void highbd_variance64(const uint8_t *a8, int a_stride,
                              const uint8_t *b8, int b_stride, int w, int h,
                              uint64_t *sse, int64_t *sum) {
  const uint16_t *a = CONVERT_TO_SHORTPTR(a8);
  const uint16_t *b = CONVERT_TO_SHORTPTR(b8);
  int64_t tsum = 0;
  uint64_t tsse = 0;
  for (int i = 0; i < h; ++i) {
    int32_t lsum = 0;
    for (int j = 0; j < w; ++j) {
      const int diff = a[j] - b[j];
      lsum += diff;
      tsse += (uint32_t)(diff * diff);
    }
    tsum += lsum;
    a += a_stride;
    b += b_stride;
  }
  *sum = tsum;
  *sse = tsse;
}